

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  int iVar1;
  int width;
  
  if (-1 < atlas->CustomRectIds[0]) {
    return;
  }
  if ((atlas->Flags & 2) == 0) {
    width = 0xd9;
    iVar1 = 0x1b;
  }
  else {
    width = 2;
    iVar1 = 2;
  }
  iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,width,iVar1);
  atlas->CustomRectIds[0] = iVar1;
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    if (atlas->CustomRectIds[0] >= 0)
        return;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF*2+1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
    else
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(2, 2);
}